

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::sendMessage
          (CommonCore *this,InterfaceHandle sourceHandle,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  atomic<int> *paVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  pointer pcVar4;
  _Alloc_hider __s2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  int iVar8;
  pair<helics::route_id,_helics::ActionMessage> *ppVar9;
  FederateState *this_00;
  string *psVar10;
  long lVar11;
  FunctionExecutionFailure *this_01;
  HelicsException *pHVar12;
  ActionMessage *command;
  char *pcVar13;
  long lVar14;
  pointer_____offset_0x10___ *ppuVar15;
  size_t sVar16;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer ppVar17;
  pointer ppVar18;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view str;
  string_view fmt;
  format_args args;
  string_view message_05;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets_1;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  ActionMessage mess;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  size_type sStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Head_base<0UL,_helics::Message_*,_false> local_180;
  _Head_base<0UL,_helics::Message_*,_false> local_178;
  string local_170;
  pointer local_150;
  long *local_148;
  long local_140;
  long local_138 [2];
  string local_128;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  ActionMessage local_e8;
  
  if (sourceHandle.hid == -0x1aa152) {
    bVar7 = waitCoreRegistration(this);
    if (bVar7) {
      local_178._M_head_impl =
           (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      (message->_M_t).super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
      ActionMessage::ActionMessage
                (&local_e8,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_178);
      if (local_178._M_head_impl != (Message *)0x0) {
        CLI::std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_178,local_178._M_head_impl);
      }
      local_178._M_head_impl = (Message *)0x0;
      local_e8.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
      local_e8.source_handle.hid = -0x1aa152;
      BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e8);
      goto LAB_002f8d51;
    }
    this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
    message_00._M_str = "core is unable to register and has timed out, message was not sent";
    message_00._M_len = 0x42;
    FunctionExecutionFailure::FunctionExecutionFailure(this_01,message_00);
    ppuVar15 = &FunctionExecutionFailure::typeinfo;
    goto LAB_002f8e07;
  }
  ppVar9 = getHandleInfo(this,sourceHandle);
  if (ppVar9 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
    pcVar13 = "handle is not valid";
    sVar16 = 0x13;
  }
  else {
    if ((char)(ppVar9->second).messageID == 'e') {
      if (((ppVar9->second).messageID & 0x40000000) != 0) {
        this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
        message_02._M_str =
             "Endpoint is receive only; no messages can be sent through this endpoint";
        message_02._M_len = 0x47;
        InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)this_01,message_02);
        ppuVar15 = &InvalidFunctionCall::typeinfo;
        goto LAB_002f8e07;
      }
      local_180._M_head_impl =
           (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      (message->_M_t).super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
      ActionMessage::ActionMessage
                (&local_e8,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_180);
      if (local_180._M_head_impl != (Message *)0x0) {
        CLI::std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_180,local_180._M_head_impl);
      }
      local_180._M_head_impl = (Message *)0x0;
      uVar3 = (ppVar9->second).dest_id;
      uVar5 = (ppVar9->second).dest_handle;
      str._M_len._4_4_ = uVar5;
      str._M_len._0_4_ = uVar3;
      str._M_str = *(char **)&(ppVar9->second).source_id;
      ActionMessage::setString(&local_e8,1,str);
      local_e8.source_id.gid = (ppVar9->first).rid;
      if (local_e8.messageID == 0) {
        LOCK();
        paVar1 = &this->messageCounter;
        local_e8.messageID = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        local_e8.messageID = local_e8.messageID + 1;
      }
      local_e8.source_handle.hid = sourceHandle.hid;
      this_00 = getFederateAt(this,(LocalFederateId)(ppVar9->second).messageAction);
      lVar11 = (this_00->allowed_send_time).internalTimeCode;
      if (local_e8.actionTime.internalTimeCode < lVar11) {
        local_e8.actionTime.internalTimeCode = lVar11;
      }
      iVar8 = FederateState::loggingLevel(this_00);
      if (0x11 < iVar8) {
        prettyPrintString_abi_cxx11_(&local_128,(helics *)&local_e8,command);
        local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_dataplus._M_p;
        sStack_1a0 = local_128._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0xf;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_1a8;
        ::fmt::v11::vformat_abi_cxx11_(&local_170,(v11 *)"send_message {}",fmt,args);
        message_05._M_str = local_170._M_dataplus._M_p;
        message_05._M_len = local_170._M_string_length;
        FederateState::logMessage
                  (this_00,0x12,(string_view)(ZEXT816(0x40af02) << 0x40),message_05,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      psVar10 = ActionMessage::getString_abi_cxx11_(&local_e8,0);
      uVar2 = *(ushort *)((long)&(ppVar9->second).messageID + 2);
      if (psVar10->_M_string_length == 0) {
        if ((uVar2 >> 10 & 1) == 0) {
          pHVar12 = (HelicsException *)__cxa_allocate_exception(0x28);
          message_03._M_str = "no destination specified in message";
          message_03._M_len = 0x23;
          HelicsException::HelicsException(pHVar12,message_03);
          *(undefined ***)pHVar12 = &PTR__HelicsException_00512398;
          __cxa_throw(pHVar12,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
        }
        FederateState::getMessageDestinations
                  ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)&local_170,this_00,sourceHandle);
        if (local_170._M_dataplus._M_p != (pointer)local_170._M_string_length) {
          generateMessages(this,&local_e8,
                           (vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            *)&local_170);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_170._M_dataplus._M_p,
                          local_170.field_2._M_allocated_capacity - (long)local_170._M_dataplus._M_p
                         );
        }
        goto LAB_002f8d51;
      }
      if ((uVar2 >> 10 & 1) != 0) {
        FederateState::getMessageDestinations(&local_108,this_00,sourceHandle);
        ppVar17 = local_108.
                  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppVar18 = local_108.
                  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar10 = ActionMessage::getString_abi_cxx11_(&local_e8,0);
        local_148 = local_138;
        pcVar4 = (psVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,pcVar4,pcVar4 + psVar10->_M_string_length);
        local_1a8 = &local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,local_148,local_140 + (long)local_148);
        local_128._M_string_length = sStack_1a0;
        local_128.field_2._M_allocated_capacity =
             CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]);
        local_128._M_dataplus._M_p = (pointer)local_1a8;
        paVar6 = &local_198;
        if (local_1a8 == &local_198) {
          local_128.field_2._8_8_ = local_198._8_8_;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          paVar6 = local_1a8;
        }
        local_1a8 = paVar6;
        local_198._M_local_buf[0] = '\0';
        sStack_1a0 = 0;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_128._M_dataplus._M_p,
                   local_128._M_dataplus._M_p + local_128._M_string_length);
        __s2._M_p = local_170._M_dataplus._M_p;
        local_150 = ppVar17;
        lVar11 = (long)ppVar17 - (long)ppVar18;
        lVar14 = (lVar11 >> 3) * -0x5555555555555555 >> 2;
        local_f0 = &local_128.field_2;
        if (0 < lVar14) {
          lVar11 = lVar14 + 1;
          ppVar17 = ppVar18 + 2;
          do {
            if ((pointer)ppVar17[-2].second._M_len == (pointer)local_170._M_string_length) {
              if (((pointer)local_170._M_string_length == (pointer)0x0) ||
                 (iVar8 = bcmp(ppVar17[-2].second._M_str,__s2._M_p,local_170._M_string_length),
                 iVar8 == 0)) {
                ppVar17 = ppVar17 + -2;
                goto LAB_002f8ca5;
              }
              if ((pointer)ppVar17[-1].second._M_len == (pointer)local_170._M_string_length)
              goto LAB_002f8b5c;
            }
            else if ((pointer)ppVar17[-1].second._M_len == (pointer)local_170._M_string_length) {
              if ((pointer)local_170._M_string_length != (pointer)0x0) {
LAB_002f8b5c:
                iVar8 = bcmp(ppVar17[-1].second._M_str,__s2._M_p,local_170._M_string_length);
                if (iVar8 != 0) goto LAB_002f8b74;
              }
              ppVar17 = ppVar17 + -1;
              goto LAB_002f8ca5;
            }
LAB_002f8b74:
            if ((pointer)(ppVar17->second)._M_len == (pointer)local_170._M_string_length) {
              if (((pointer)local_170._M_string_length == (pointer)0x0) ||
                 (iVar8 = bcmp((ppVar17->second)._M_str,__s2._M_p,local_170._M_string_length),
                 iVar8 == 0)) goto LAB_002f8ca5;
              if ((pointer)ppVar17[1].second._M_len == (pointer)local_170._M_string_length) {
LAB_002f8bb5:
                iVar8 = bcmp(ppVar17[1].second._M_str,__s2._M_p,local_170._M_string_length);
                if (iVar8 == 0) goto LAB_002f8c91;
              }
            }
            else if ((pointer)ppVar17[1].second._M_len == (pointer)local_170._M_string_length) {
              if ((pointer)local_170._M_string_length != (pointer)0x0) goto LAB_002f8bb5;
LAB_002f8c91:
              ppVar17 = ppVar17 + 1;
              goto LAB_002f8ca5;
            }
            lVar11 = lVar11 + -1;
            ppVar17 = ppVar17 + 4;
          } while (1 < lVar11);
          lVar11 = (long)local_150 - (long)(ppVar18 + lVar14 * 4);
          ppVar18 = ppVar18 + lVar14 * 4;
        }
        lVar11 = (lVar11 >> 3) * -0x5555555555555555;
        if (lVar11 == 1) {
LAB_002f8c60:
          if (((pointer)(ppVar18->second)._M_len != (pointer)local_170._M_string_length) ||
             ((ppVar17 = ppVar18, (pointer)local_170._M_string_length != (pointer)0x0 &&
              (iVar8 = bcmp((ppVar18->second)._M_str,__s2._M_p,local_170._M_string_length),
              iVar8 != 0)))) {
LAB_002f8c7e:
            ppVar17 = local_150;
          }
        }
        else if (lVar11 == 2) {
LAB_002f8c3e:
          if (((pointer)(ppVar18->second)._M_len != (pointer)local_170._M_string_length) ||
             ((ppVar17 = ppVar18, (pointer)local_170._M_string_length != (pointer)0x0 &&
              (iVar8 = bcmp((ppVar18->second)._M_str,__s2._M_p,local_170._M_string_length),
              iVar8 != 0)))) {
            ppVar18 = ppVar18 + 1;
            goto LAB_002f8c60;
          }
        }
        else {
          if (lVar11 != 3) goto LAB_002f8c7e;
          if (((pointer)(ppVar18->second)._M_len != (pointer)local_170._M_string_length) ||
             ((ppVar17 = ppVar18, (pointer)local_170._M_string_length != (pointer)0x0 &&
              (iVar8 = bcmp((ppVar18->second)._M_str,__s2._M_p,local_170._M_string_length),
              iVar8 != 0)))) {
            ppVar18 = ppVar18 + 1;
            goto LAB_002f8c3e;
          }
        }
LAB_002f8ca5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__s2._M_p != &local_170.field_2) {
          operator_delete(__s2._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != local_f0) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        if (local_148 != local_138) {
          operator_delete(local_148,local_138[0] + 1);
        }
        if (ppVar17 ==
            local_108.
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pHVar12 = (HelicsException *)__cxa_allocate_exception(0x28);
          message_04._M_str = "targeted endpoint destination not in target list";
          message_04._M_len = 0x30;
          HelicsException::HelicsException(pHVar12,message_04);
          *(undefined ***)pHVar12 = &PTR__HelicsException_00512398;
          __cxa_throw(pHVar12,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
        }
        if (local_108.
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.
                          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_108.
                                super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.
                                super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e8);
LAB_002f8d51:
      ActionMessage::~ActionMessage(&local_e8);
      return;
    }
    this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
    pcVar13 = "handle does not point to an endpoint";
    sVar16 = 0x24;
  }
  message_01._M_str = pcVar13;
  message_01._M_len = sVar16;
  InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message_01);
  ppuVar15 = &InvalidIdentifier::typeinfo;
LAB_002f8e07:
  __cxa_throw(this_01,ppuVar15,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::sendMessage(InterfaceHandle sourceHandle, std::unique_ptr<Message> message)
{
    if (sourceHandle == gDirectSendHandle) {
        if (!waitCoreRegistration()) {
            throw(FunctionExecutionFailure(
                "core is unable to register and has timed out, message was not sent"));
        }
        ActionMessage mess(std::move(message));
        mess.source_id = global_id.load();
        mess.source_handle = sourceHandle;
        addActionMessage(std::move(mess));
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }
    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    if (checkActionFlag(*hndl, receive_only_flag)) {
        throw(InvalidFunctionCall(
            "Endpoint is receive only; no messages can be sent through this endpoint"));
    }
    ActionMessage mess(std::move(message));

    mess.setString(sourceStringLoc, hndl->key);
    mess.source_id = hndl->getFederateId();
    mess.source_handle = sourceHandle;
    if (mess.messageID == 0) {
        mess.messageID = ++messageCounter;
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    auto minTime = fed->nextAllowedSendTime();
    if (mess.actionTime < minTime) {
        mess.actionTime = minTime;
    }

    if (fed->loggingLevel() >= HELICS_LOG_LEVEL_DATA) {
        fed->logMessage(HELICS_LOG_LEVEL_DATA,
                        "",
                        fmt::format("send_message {}", prettyPrintString(mess)));
    }
    if (mess.getString(targetStringLoc).empty()) {
        if (checkActionFlag(*hndl, targeted_flag)) {
            auto targets = fed->getMessageDestinations(sourceHandle);
            if (targets.empty()) {
                return;
            }
            generateMessages(mess, targets);
        } else {
            throw(InvalidParameter("no destination specified in message"));
        }
    } else {
        if (checkActionFlag(*hndl, targeted_flag)) {
            auto targets = fed->getMessageDestinations(sourceHandle);
            auto res = std::find_if(targets.begin(),
                                    targets.end(),
                                    [destination = mess.getString(targetStringLoc)](
                                        const auto& val) { return (val.second == destination); });
            if (res == targets.end()) {
                throw(InvalidParameter("targeted endpoint destination not in target list"));
            }
        }
        addActionMessage(std::move(mess));
    }
}